

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QSslCertificate> * __thiscall
QList<QSslCertificate>::operator+=(QList<QSslCertificate> *this,QList<QSslCertificate> *l)

{
  QList<QSslCertificate> *in_RDI;
  QList<QSslCertificate> *unaff_retaddr;
  
  append(unaff_retaddr,in_RDI);
  return in_RDI;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }